

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall pegmatite::CharacterExpr::parse_term(CharacterExpr *this,Context *con)

{
  int *piVar1;
  char32_t cVar2;
  Index IVar3;
  int iVar4;
  char32_t cVar5;
  ulong uVar6;
  
  if (((con->position).it.buffer != (con->finish).buffer) ||
     (uVar6 = (con->position).it.idx, uVar6 != (con->finish).idx)) {
    cVar2 = this->character;
    cVar5 = Context::symbol(con);
    uVar6 = (con->position).it.idx;
    if (cVar5 == cVar2) {
      (con->position).it.idx = uVar6 + 1;
      piVar1 = &(con->position).col;
      *piVar1 = *piVar1 + 1;
      return true;
    }
  }
  if ((con->error_pos).it.idx < uVar6) {
    iVar4 = (con->position).col;
    (con->error_pos).line = (con->position).line;
    (con->error_pos).col = iVar4;
    IVar3 = (con->position).it.idx;
    (con->error_pos).it.buffer = (con->position).it.buffer;
    (con->error_pos).it.idx = IVar3;
  }
  return false;
}

Assistant:

bool CharacterExpr::parse_term(Context &con) const
{
	return parseCharacter(con, character);
}